

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<char>::swap(PropertyT<char> *this,size_t _i0,size_t _i1)

{
  reference __a;
  reference __b;
  size_t _i1_local;
  size_t _i0_local;
  PropertyT<char> *this_local;
  
  __a = std::vector<char,_std::allocator<char>_>::operator[](&this->data_,_i0);
  __b = std::vector<char,_std::allocator<char>_>::operator[](&this->data_,_i1);
  std::swap<char>(__a,__b);
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }